

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage7_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  __m256i *palVar7;
  __m256i *palVar8;
  __m256i temp1;
  __m256i *in_stack_ffffffffffffff98;
  __m256i *clamp_hi_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  lVar1 = in_RDI[3][0];
  lVar3 = in_RDI[3][1];
  lVar5 = in_RDI[3][2];
  palVar7 = (__m256i *)in_RDI[3][3];
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  palVar8 = palVar7;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xd][0] = lVar2;
  in_RDI[0xd][1] = lVar4;
  in_RDI[0xd][2] = lVar6;
  in_RDI[0xd][3] = (longlong)palVar7;
  in_RDI[10][0] = lVar1;
  in_RDI[10][1] = lVar3;
  in_RDI[10][2] = lVar5;
  in_RDI[10][3] = (longlong)palVar8;
  clamp_hi_00 = palVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  palVar7 = palVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xc][0] = lVar2;
  in_RDI[0xc][1] = lVar4;
  in_RDI[0xc][2] = lVar6;
  in_RDI[0xc][3] = (longlong)palVar7;
  in_RDI[0xb][0] = lVar1;
  in_RDI[0xb][1] = lVar3;
  in_RDI[0xb][2] = lVar5;
  in_RDI[0xb][3] = (longlong)palVar8;
  in1_03[1] = (longlong)in_RSI;
  in1_03[0] = (longlong)in_RDX;
  in1_03[2] = (longlong)in_RDI;
  in1_03[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_03,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_04[1] = (longlong)in_RSI;
  in1_04[0] = (longlong)in_RDX;
  in1_04[2] = (longlong)in_RDI;
  in1_04[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_04,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_05[1] = (longlong)in_RSI;
  in1_05[0] = (longlong)in_RDX;
  in1_05[2] = (longlong)in_RDI;
  in1_05[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_05,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_06[1] = (longlong)in_RSI;
  in1_06[0] = (longlong)in_RDX;
  in1_06[2] = (longlong)in_RDI;
  in1_06[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_06,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_07[1] = (longlong)in_RSI;
  in1_07[0] = (longlong)in_RDX;
  in1_07[2] = (longlong)in_RDI;
  in1_07[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_07,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_08[1] = (longlong)in_RSI;
  in1_08[0] = (longlong)in_RDX;
  in1_08[2] = (longlong)in_RDI;
  in1_08[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_08,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_09[1] = (longlong)in_RSI;
  in1_09[0] = (longlong)in_RDX;
  in1_09[2] = (longlong)in_RDI;
  in1_09[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_09,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_10[1] = (longlong)in_RSI;
  in1_10[0] = (longlong)in_RDX;
  in1_10[2] = (longlong)in_RDI;
  in1_10[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_10,in_RCX,in_R8,in_R9,clamp_hi_00);
  return;
}

Assistant:

static inline void idct32_stage7_avx2(__m256i *bf1, const __m256i *cospim32,
                                      const __m256i *cospi32,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi,
                                      const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  addsub_avx2(bf1[0], bf1[7], bf1 + 0, bf1 + 7, clamp_lo, clamp_hi);
  addsub_avx2(bf1[1], bf1[6], bf1 + 1, bf1 + 6, clamp_lo, clamp_hi);
  addsub_avx2(bf1[2], bf1[5], bf1 + 2, bf1 + 5, clamp_lo, clamp_hi);
  addsub_avx2(bf1[3], bf1[4], bf1 + 3, bf1 + 4, clamp_lo, clamp_hi);

  temp1 = half_btf_avx2(cospim32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[13] = half_btf_avx2(cospi32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[10] = temp1;
  temp2 = half_btf_avx2(cospim32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[12] = half_btf_avx2(cospi32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[11] = temp2;

  addsub_avx2(bf1[16], bf1[23], bf1 + 16, bf1 + 23, clamp_lo, clamp_hi);
  addsub_avx2(bf1[17], bf1[22], bf1 + 17, bf1 + 22, clamp_lo, clamp_hi);
  addsub_avx2(bf1[18], bf1[21], bf1 + 18, bf1 + 21, clamp_lo, clamp_hi);
  addsub_avx2(bf1[19], bf1[20], bf1 + 19, bf1 + 20, clamp_lo, clamp_hi);
  addsub_avx2(bf1[31], bf1[24], bf1 + 31, bf1 + 24, clamp_lo, clamp_hi);
  addsub_avx2(bf1[30], bf1[25], bf1 + 30, bf1 + 25, clamp_lo, clamp_hi);
  addsub_avx2(bf1[29], bf1[26], bf1 + 29, bf1 + 26, clamp_lo, clamp_hi);
  addsub_avx2(bf1[28], bf1[27], bf1 + 28, bf1 + 27, clamp_lo, clamp_hi);
}